

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
::nosize_transfer_element
          (void *param_1,undefined8 param_2,undefined8 param_3,size_t param_4,long *param_5)

{
  moved_type mVar1;
  destroy_element_on_exit d;
  pair<const_slang::ast::ValueSymbol_*&&,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_&&>
  *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  
  *param_5 = *param_5 + 1;
  position_for(param_4,(arrays_type *)param_1);
  mVar1 = flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
          ::move((element_type *)0x81a2b1);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
  ::
  nosize_unchecked_emplace_at<std::pair<slang::ast::ValueSymbol_const*&&,slang::IntervalMap<unsigned_long,std::monostate,3u>&&>>
            ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
              *)param_1,(arrays_type *)mVar1.second,(size_t)mVar1.first,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0x81a2ff);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }